

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool absl::SimpleAtod(string_view str,Nonnull<double_*> out)

{
  bool bVar1;
  const_reference pvVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  size_type sVar5;
  double *in_RDX;
  double dVar6;
  string_view sVar7;
  from_chars_result fVar8;
  from_chars_result result;
  chars_format in_stack_ffffffffffffff8c;
  double *in_stack_ffffffffffffff90;
  Nonnull<const_char_*> in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t local_30;
  char *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  *in_RDX = 0.0;
  sVar7._M_str = in_stack_ffffffffffffffb0;
  sVar7._M_len = in_stack_ffffffffffffffa8;
  sVar7 = StripAsciiWhitespace(sVar7);
  local_30 = sVar7._M_len;
  local_18._M_len = local_30;
  local_28 = sVar7._M_str;
  local_18._M_str = local_28;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if ((!bVar1) &&
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
     *pvVar2 == '+')) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_18,1);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if ((!bVar1) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
       *pvVar2 == '-')) {
      return false;
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  fVar8 = from_chars(pvVar3,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c);
  pvVar3 = fVar8.ptr;
  if (fVar8.ec == invalid_argument) {
    local_1 = false;
  }
  else {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (pvVar3 == pvVar4 + sVar5) {
      if (fVar8.ec == result_out_of_range) {
        if (*in_RDX <= 1.0) {
          if (*in_RDX <= -1.0 && *in_RDX != -1.0) {
            dVar6 = std::numeric_limits<double>::infinity();
            *in_RDX = -dVar6;
          }
        }
        else {
          dVar6 = std::numeric_limits<double>::infinity();
          *in_RDX = dVar6;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SimpleAtod(absl::string_view str, absl::Nonnull<double*> out) {
  *out = 0.0;
  str = StripAsciiWhitespace(str);
  // std::from_chars doesn't accept an initial +, but SimpleAtod does, so if one
  // is present, skip it, while avoiding accepting "+-0" as valid.
  if (!str.empty() && str[0] == '+') {
    str.remove_prefix(1);
    if (!str.empty() && str[0] == '-') {
      return false;
    }
  }
  auto result = absl::from_chars(str.data(), str.data() + str.size(), *out);
  if (result.ec == std::errc::invalid_argument) {
    return false;
  }
  if (result.ptr != str.data() + str.size()) {
    // not all non-whitespace characters consumed
    return false;
  }
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (*out > 1.0) {
      *out = std::numeric_limits<double>::infinity();
    } else if (*out < -1.0) {
      *out = -std::numeric_limits<double>::infinity();
    }
  }
  return true;
}